

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KM_xml.h
# Opt level: O2

bool Kumu::apply_visitor<Kumu::AttributeVisitor>(XMLElement *element,AttributeVisitor *visitor)

{
  bool bVar1;
  XMLElement *pXVar2;
  XMLElement *pXVar3;
  
  pXVar2 = element + 0x18;
  pXVar3 = pXVar2;
  do {
    pXVar3 = *(XMLElement **)pXVar3;
    if (pXVar3 == pXVar2) break;
    bVar1 = AttributeVisitor::Element(visitor,*(XMLElement **)(pXVar3 + 0x10));
    if (!bVar1) break;
    bVar1 = apply_visitor<Kumu::AttributeVisitor>(*(XMLElement **)(pXVar3 + 0x10),visitor);
  } while (bVar1);
  return pXVar3 == pXVar2;
}

Assistant:

bool
    apply_visitor(const XMLElement& element, VisitorType& visitor)
    {
      const ElementList& l = element.GetChildren();
      ElementList::const_iterator i;
      
      for ( i = l.begin(); i != l.end(); ++i )
	{
	  if ( ! visitor.Element(**i) )
	    {
	      return false;
	    }

	  if ( ! apply_visitor(**i, visitor) )
	    {
	      return false;
	    }
	}

      return true;
    }